

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

string * upperCaseFirst(string *input)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  string *in_RSI;
  string *input_local;
  string *output;
  
  std::__cxx11::string::string((string *)input,in_RSI);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
  iVar1 = toupper((int)*pcVar2);
  puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)input);
  *puVar3 = (char)iVar1;
  return input;
}

Assistant:

std::string upperCaseFirst (const std::string& input)
{
  std::string output {input};
  output[0] = toupper (output[0]);
  return output;
}